

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert *self,int new_size,ImDrawVert v)

{
  ImVec2 *pIVar1;
  ImDrawVert *pIVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = self->Capacity;
  if (iVar5 < new_size) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    pIVar2 = (ImDrawVert *)ImGui::MemAlloc((long)iVar5 * 0x14);
    if (self->Data != (ImDrawVert *)0x0) {
      memcpy(pIVar2,self->Data,(long)self->Size * 0x14);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar2;
    self->Capacity = iVar5;
  }
  iVar5 = self->Size;
  if (iVar5 < new_size) {
    lVar3 = (long)new_size - (long)iVar5;
    lVar4 = (long)iVar5 * 0x14;
    do {
      pIVar2 = self->Data;
      *(ImU32 *)((long)&pIVar2->col + lVar4) = v.col;
      pIVar1 = (ImVec2 *)((long)&(pIVar2->pos).x + lVar4);
      *pIVar1 = v.pos;
      pIVar1[1] = v.uv;
      lVar4 = lVar4 + 0x14;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert* self,int new_size,const ImDrawVert v)
{
    return self->resize(new_size,v);
}